

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ScatterAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatteralongaxis(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3ba) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3ba;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ScatterAlongAxisLayerParams::ScatterAlongAxisLayerParams(this_00.scatteralongaxis_);
    (this->layer_).scatteralongaxis_ = (ScatterAlongAxisLayerParams *)this_00;
  }
  return (ScatterAlongAxisLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterAlongAxisLayerParams* NeuralNetworkLayer::mutable_scatteralongaxis() {
  if (!has_scatteralongaxis()) {
    clear_layer();
    set_has_scatteralongaxis();
    layer_.scatteralongaxis_ = new ::CoreML::Specification::ScatterAlongAxisLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatterAlongAxis)
  return layer_.scatteralongaxis_;
}